

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkreplyimpl.cpp
# Opt level: O0

void __thiscall
QNetworkReplyImplPrivate::appendDownstreamData(QNetworkReplyImplPrivate *this,QByteDataBuffer *data)

{
  ulong uVar1;
  qsizetype qVar2;
  QByteArray *this_00;
  char *pcVar3;
  QNetworkReplyImplPrivate *in_RDI;
  QByteArray *item;
  qsizetype i;
  qint64 bytesWritten;
  QNetworkReplyImpl *q;
  QByteArray *in_stack_ffffffffffffffa8;
  QByteDataBuffer *in_stack_ffffffffffffffb0;
  QNetworkReplyImplPrivate *in_stack_ffffffffffffffd0;
  QNetworkReplyImplPrivate *pQVar4;
  QNetworkReplyImplPrivate *this_01;
  long local_20;
  
  q_func(in_RDI);
  uVar1 = QIODevice::isOpen();
  if ((uVar1 & 1) != 0) {
    if (((in_RDI->cacheEnabled & 1U) != 0) && (in_RDI->cacheSaveDevice == (QIODevice *)0x0)) {
      initCacheSaveDevice(in_stack_ffffffffffffffd0);
    }
    local_20 = 0;
    pQVar4 = (QNetworkReplyImplPrivate *)0x0;
    while (this_01 = pQVar4, qVar2 = QByteDataBuffer::bufferCount((QByteDataBuffer *)0x1ebad6),
          (long)pQVar4 < qVar2) {
      this_00 = QByteDataBuffer::operator[]
                          (in_stack_ffffffffffffffb0,(qsizetype)in_stack_ffffffffffffffa8);
      if (in_RDI->cacheSaveDevice != (QIODevice *)0x0) {
        in_stack_ffffffffffffffb0 = (QByteDataBuffer *)in_RDI->cacheSaveDevice;
        pcVar3 = QByteArray::constData((QByteArray *)0x1ebb37);
        QByteArray::size(this_00);
        QIODevice::write((char *)in_stack_ffffffffffffffb0,(longlong)pcVar3);
      }
      QIODevicePrivate::QRingBufferRef::append
                ((QRingBufferRef *)in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
      qVar2 = QByteArray::size(this_00);
      local_20 = qVar2 + local_20;
      pQVar4 = (QNetworkReplyImplPrivate *)&(this_01->super_QNetworkReplyPrivate).field_0x1;
    }
    QByteDataBuffer::clear(in_stack_ffffffffffffffb0);
    in_RDI->bytesDownloaded = local_20 + in_RDI->bytesDownloaded;
    appendDownstreamDataSignalEmissions(this_01);
  }
  return;
}

Assistant:

void QNetworkReplyImplPrivate::appendDownstreamData(QByteDataBuffer &data)
{
    Q_Q(QNetworkReplyImpl);
    if (!q->isOpen())
        return;

    if (cacheEnabled && !cacheSaveDevice) {
        initCacheSaveDevice();
    }

    qint64 bytesWritten = 0;
    for (qsizetype i = 0; i < data.bufferCount(); ++i) {
        QByteArray const &item = data[i];

        if (cacheSaveDevice)
            cacheSaveDevice->write(item.constData(), item.size());
        buffer.append(item);

        bytesWritten += item.size();
    }
    data.clear();

    bytesDownloaded += bytesWritten;

    appendDownstreamDataSignalEmissions();
}